

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * CTcPrsOpUnary::create_oneof_node(CTcEmbedBuilder *b,CTPNList *lst,char *attrs)

{
  int iVar1;
  CTcSymObj *obj;
  long *plVar2;
  CTcPrsNode *pCVar3;
  CTcPrsSymtab *curtab;
  CTcPrsSymtab *pCVar4;
  CTcConstVal local_50;
  undefined4 extraout_var;
  
  if ((G_prs->field_0xec & 4) == 0) {
    obj = CTcParser::add_gen_obj(G_prs,"OneOfIndexGen");
    if (obj != (CTcSymObj *)0x0) {
      local_50.val_.intval_ = (long)(lst->super_CTPNListBase).cnt_;
      local_50._32_1_ = local_50._32_1_ & 0xfe;
      local_50.typ_ = TC_CVT_INT;
      CTcParser::add_gen_obj_prop(G_prs,obj,"numItems",&local_50);
      CTcParser::add_gen_obj_prop(G_prs,obj,"listAttrs",attrs);
      goto LAB_002335a4;
    }
    pCVar4 = G_prs->global_symtab_;
    do {
      iVar1 = (*pCVar4->_vptr_CTcPrsSymtab[2])(pCVar4,"OneOfIndexGen",0xd);
      plVar2 = (long *)CONCAT44(extraout_var,iVar1);
      if (plVar2 != (long *)0x0) goto LAB_0023358c;
      pCVar4 = pCVar4->parent_;
    } while (pCVar4 != (CTcPrsSymtab *)0x0);
    plVar2 = (long *)0x0;
LAB_0023358c:
    if ((plVar2 == (long *)0x0) ||
       ((**(code **)(*plVar2 + 0x78))(plVar2), *(int *)((long)plVar2 + 0x24) != 2)) {
      obj = (CTcSymObj *)0x0;
      CTcTokenizer::log_error(0x2d2b);
      goto LAB_002335a4;
    }
  }
  obj = (CTcSymObj *)0x0;
LAB_002335a4:
  pCVar3 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x20);
  iVar1 = (**b->_vptr_CTcEmbedBuilder)(b);
  *(int *)&pCVar3[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = iVar1;
  pCVar3[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)lst;
  pCVar3[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)obj;
  (pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00362ee0;
  return pCVar3;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::create_oneof_node(
    CTcEmbedBuilder *b, CTPNList *lst, const char *attrs)
{
    /*
     *   If we're actually compiling (not just doing a symbol extraction
     *   pass), create our list state object.  This is an anonymous
     *   TadsObject of class OneOfIndexGen, with the following properties:
     *   
     *.    numItems = number of items in the list (integer)
     *.    listAttrs = our 'attrs' list attributes value (string)
     */
    CTcSymObj *obj = 0;
    if (!G_prs->get_syntax_only())
    {
        /* geneate our anonymous OneOfIndexGen instance */
        obj = G_prs->add_gen_obj("OneOfIndexGen");
        if (obj != 0)
        {
            G_prs->add_gen_obj_prop(obj, "numItems", lst->get_count());
            G_prs->add_gen_obj_prop(obj, "listAttrs", attrs);
        }
        else
        {
            /* check to see if OneOfIndexGen is undefined */
            CTcSymbol *cls = G_prs->get_global_symtab()->find(
                "OneOfIndexGen", 13);
            if (cls == 0 || cls->get_type() != TC_SYM_OBJ)
                G_tok->log_error(TCERR_ONEOF_REQ_GENCLS);
        }
    }

    /* return the <<one of>> node */
    return new CTPNStrOneOf(b->is_double(), lst, obj);
}